

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseReservedNames
          (Parser *this,DescriptorProto *message,LocationRecorder *parent_location)

{
  bool bVar1;
  string *name;
  string_view text;
  string_view text_00;
  LocationRecorder location;
  
  do {
    LocationRecorder::LocationRecorder
              (&location,parent_location,*(int *)((long)&message->field_0 + 0xb8));
    name = (string *)
           internal::RepeatedPtrFieldBase::AddString
                     (&(message->field_0)._impl_.reserved_name_.super_RepeatedPtrFieldBase);
    bVar1 = ParseReservedName(this,name,(ErrorMaker)ZEXT816(0x37282e));
    LocationRecorder::~LocationRecorder(&location);
    if (!bVar1) {
      return false;
    }
    text._M_str = ",";
    text._M_len = 1;
    bVar1 = TryConsume(this,text);
  } while (bVar1);
  text_00._M_str = ";";
  text_00._M_len = 1;
  bVar1 = ConsumeEndOfDeclaration(this,text_00,parent_location);
  return bVar1;
}

Assistant:

bool Parser::ParseReservedNames(DescriptorProto* message,
                                const LocationRecorder& parent_location) {
  do {
    LocationRecorder location(parent_location, message->reserved_name_size());
    DO(ParseReservedName(message->add_reserved_name(),
                         "Expected field name string literal."));
  } while (TryConsume(","));
  DO(ConsumeEndOfDeclaration(";", &parent_location));
  return true;
}